

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O1

void __thiscall
TEST_MockComparatorCopierTest_removingCopiersWorksHierachically_Test::testBody
          (TEST_MockComparatorCopierTest_removingCopiersWorksHierachically_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UtestShell *test;
  MockFailureReporterInstaller failureReporterInstaller;
  MyTypeForTesting object;
  MyTypeForTestingCopier copier;
  MockNoWayToCopyCustomTypeFailure expectedFailure;
  MockFailureReporterInstaller local_c1;
  SimpleString local_c0;
  SimpleString local_b0;
  SimpleString local_a0;
  undefined **local_90;
  undefined8 *local_88;
  undefined **local_80;
  TestFailure local_78;
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_c1);
  local_90 = &PTR__MyTypeForTesting_002b3450;
  local_88 = (undefined8 *)
             operator_new(8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
                          ,0x2e);
  *local_88 = 1;
  local_80 = &PTR__MockNamedValueCopier_002b3c68;
  SimpleString::SimpleString((SimpleString *)&local_78,"scope");
  pMVar2 = mock((SimpleString *)&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c0,"MyTypeForTesting");
  (*pMVar2->_vptr_MockSupport[0x2d])(pMVar2,&local_c0,&local_80);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  SimpleString::SimpleString((SimpleString *)&local_78,"");
  pMVar2 = mock((SimpleString *)&local_78,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x2f])(pMVar2);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  SimpleString::SimpleString((SimpleString *)&local_78,"scope");
  pMVar2 = mock((SimpleString *)&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[3])(pMVar2,&local_c0);
  SimpleString::SimpleString(&local_a0,"MyTypeForTesting");
  SimpleString::SimpleString(&local_b0,"bar");
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x38))
            ((long *)CONCAT44(extraout_var,iVar1),&local_a0,&local_b0,&local_90);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  SimpleString::SimpleString((SimpleString *)&local_78,"scope");
  pMVar2 = mock((SimpleString *)&local_78,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_c0,"foo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_c0);
  SimpleString::SimpleString(&local_a0,"MyTypeForTesting");
  SimpleString::SimpleString(&local_b0,"bar");
  (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x30))
            ((long *)CONCAT44(extraout_var_00,iVar1),&local_a0,&local_b0,&local_90);
  SimpleString::~SimpleString(&local_b0);
  SimpleString::~SimpleString(&local_a0);
  SimpleString::~SimpleString(&local_c0);
  SimpleString::~SimpleString((SimpleString *)&local_78);
  test = mockFailureTest();
  SimpleString::SimpleString(&local_c0,"MyTypeForTesting");
  MockNoWayToCopyCustomTypeFailure::MockNoWayToCopyCustomTypeFailure
            ((MockNoWayToCopyCustomTypeFailure *)&local_78,test,&local_c0);
  SimpleString::~SimpleString(&local_c0);
  CHECK_EXPECTED_MOCK_FAILURE_LOCATION
            ((MockFailure *)&local_78,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockComparatorCopierTest.cpp"
             ,0x206);
  TestFailure::~TestFailure(&local_78);
  local_90 = &PTR__MyTypeForTesting_002b3450;
  if (local_88 != (undefined8 *)0x0) {
    operator_delete(local_88,8);
  }
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_c1);
  return;
}

Assistant:

TEST(MockComparatorCopierTest, removingCopiersWorksHierachically)
{
    MockFailureReporterInstaller failureReporterInstaller;
    MyTypeForTesting object(1);

    MyTypeForTestingCopier copier;

    mock("scope").installCopier("MyTypeForTesting", copier);
    mock().removeAllComparatorsAndCopiers();
    mock("scope").expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &object);
    mock("scope").actualCall("foo").withOutputParameterOfType("MyTypeForTesting", "bar", &object);

    MockNoWayToCopyCustomTypeFailure expectedFailure(mockFailureTest(), "MyTypeForTesting");
    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}